

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::ExternalCommand::configureAttribute
          (ExternalCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  ConfigureContext *pCVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool local_ed9;
  bool local_e49;
  bool local_db9;
  bool local_d49;
  Twine local_d30;
  Twine local_d18;
  Twine local_d00;
  Twine local_ce8;
  Twine local_cd0;
  Twine local_cb8;
  char *local_ca0 [2];
  ExternalCommand *local_c90;
  char *local_c88;
  char *local_c80 [2];
  ExternalCommand *local_c70;
  char *local_c68;
  char *local_c60 [2];
  void *local_c50;
  size_t local_c48;
  char *local_c40 [2];
  ExternalCommand *local_c30;
  char *local_c28;
  Twine local_c20;
  Twine local_c08;
  Twine local_bf0;
  Twine local_bd8;
  Twine local_bc0;
  Twine local_ba8;
  Twine local_b90;
  char *local_b78 [2];
  ExternalCommand *local_b68;
  char *local_b60;
  char *local_b58 [2];
  ExternalCommand *local_b48;
  char *local_b40;
  char *local_b38 [2];
  void *local_b28;
  size_t local_b20;
  char *local_b18 [2];
  ExternalCommand *local_b08;
  char *local_b00;
  Twine local_af8;
  Twine local_ae0;
  Twine local_ac8;
  Twine local_ab0;
  Twine local_a98;
  Twine local_a80;
  Twine local_a68;
  char *local_a50 [2];
  ExternalCommand *local_a40;
  char *local_a38;
  char *local_a30 [2];
  ExternalCommand *local_a20;
  char *local_a18;
  char *local_a10 [2];
  void *local_a00;
  size_t local_9f8;
  char *local_9f0 [2];
  ExternalCommand *local_9e0;
  char *local_9d8;
  Twine local_9d0;
  Twine local_9b8;
  Twine local_9a0;
  Twine local_988;
  Twine local_970;
  Twine local_958;
  Twine local_940;
  char *local_928 [2];
  ExternalCommand *local_918;
  char *local_910;
  char *local_908 [2];
  ExternalCommand *local_8f8;
  char *local_8f0;
  char *local_8e8 [2];
  char *local_8d8;
  size_t local_8d0;
  ConfigureContext *local_8c8;
  ConfigureContext *ctx_local;
  ExternalCommand *this_local;
  StringRef value_local;
  StringRef name_local;
  ExternalCommand *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  ExternalCommand *local_840;
  char *local_838;
  char *local_830;
  size_t local_828;
  char *local_820;
  size_t local_818;
  void *local_810;
  size_t local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  ExternalCommand *local_7e0;
  char *local_7d8;
  char *local_7d0;
  size_t local_7c8;
  char *local_7c0;
  size_t local_7b8;
  void *local_7b0;
  size_t local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  ExternalCommand *local_780;
  char *local_778;
  char *local_770;
  size_t local_768;
  char *local_760;
  size_t local_758;
  void *local_750;
  size_t local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  ExternalCommand *local_720;
  char *local_718;
  char *local_710;
  size_t local_708;
  char *local_700;
  size_t local_6f8;
  char *local_6f0;
  size_t local_6e8;
  char *local_6e0;
  char **local_6d8;
  char *local_6d0;
  char **local_6c8;
  char *local_6c0;
  char **local_6b8;
  char *local_6b0;
  char **local_6a8;
  char *local_6a0;
  char **local_698;
  char *local_690;
  char **local_688;
  char *local_680;
  char **local_678;
  char *local_670;
  char **local_668;
  char *local_660;
  char **local_658;
  char *local_650;
  char **local_648;
  char *local_640;
  char **local_638;
  char *local_630;
  char **local_628;
  char *local_620;
  char **local_618;
  char *local_610;
  char **local_608;
  char *local_600;
  char **local_5f8;
  char *local_5f0;
  char *local_5e8;
  ExternalCommand *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  ExternalCommand *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  ExternalCommand *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  ExternalCommand *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  ExternalCommand *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  ExternalCommand *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  ExternalCommand *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  ExternalCommand *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  ExternalCommand *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  ExternalCommand *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  ExternalCommand *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  ExternalCommand *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  ExternalCommand *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  ExternalCommand *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  ExternalCommand *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  ExternalCommand *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  ExternalCommand *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  ExternalCommand *local_360;
  char *local_358;
  ExternalCommand **local_350;
  char *local_348;
  char *local_340;
  ExternalCommand **local_338;
  char *local_330;
  char *local_328;
  ExternalCommand **local_320;
  char *local_318;
  char *local_310;
  ExternalCommand **local_308;
  char *local_300;
  char *local_2f8;
  ExternalCommand **local_2f0;
  char *local_2e8;
  char *local_2e0;
  ExternalCommand **local_2d8;
  char *local_2d0;
  char *local_2c8;
  char **local_2c0;
  char *local_2b8;
  size_t local_2b0;
  ExternalCommand **local_2a8;
  char *local_2a0;
  char *local_298;
  void **local_290;
  char *local_288;
  size_t local_280;
  ExternalCommand **local_278;
  char *local_270;
  char *local_268;
  void **local_260;
  char *local_258;
  size_t local_250;
  ExternalCommand **local_248;
  char *local_240;
  char *local_238;
  void **local_230;
  char *local_228;
  size_t local_220;
  ExternalCommand **local_218;
  char *local_210;
  char *local_208;
  ExternalCommand **local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  ExternalCommand *local_1d8;
  int local_1cc;
  char *local_1c8;
  char *local_1c0;
  ExternalCommand *local_1b8;
  int local_1ac;
  size_t local_1a8;
  char *local_1a0;
  void *local_198;
  int local_18c;
  char *local_188;
  char *local_180;
  ExternalCommand *local_178;
  int local_16c;
  size_t local_168;
  char *local_160;
  void *local_158;
  int local_14c;
  char *local_148;
  char *local_140;
  ExternalCommand *local_138;
  int local_12c;
  size_t local_128;
  char *local_120;
  void *local_118;
  int local_10c;
  char *local_108;
  char *local_100;
  ExternalCommand *local_f8;
  int local_ec;
  size_t local_e8;
  char *local_e0;
  char *local_d8;
  int local_cc;
  char *local_c8;
  char *local_c0;
  ExternalCommand *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  ExternalCommand *local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  ExternalCommand *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  ExternalCommand *local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  ExternalCommand *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  ExternalCommand *local_18;
  int local_c;
  
  value_local.Data = (char *)value.Length;
  this_local = (ExternalCommand *)value.Data;
  sVar2 = name.Length;
  local_8d8 = name.Data;
  local_6d8 = local_8e8;
  local_6e0 = "allow-missing-inputs";
  local_8e8[0] = "allow-missing-inputs";
  local_8d0 = sVar2;
  local_8c8 = ctx;
  ctx_local = (ConfigureContext *)this;
  value_local.Length = (size_t)local_8d8;
  local_708 = strlen("allow-missing-inputs");
  local_6f0 = local_8d8;
  local_6e8 = local_8d0;
  local_700 = local_8e8[0];
  local_710 = local_8e8[0];
  local_2b8 = local_8e8[0];
  local_2c0 = &local_6f0;
  local_d49 = false;
  local_6f8 = local_708;
  local_2b0 = local_708;
  if (local_8d0 == local_708) {
    local_d8 = local_8d8;
    local_e0 = local_8e8[0];
    local_e8 = local_708;
    if (local_708 == 0) {
      local_cc = 0;
    }
    else {
      local_cc = memcmp(local_8d8,local_8e8[0],local_708);
    }
    local_d49 = local_cc == 0;
  }
  if (local_d49) {
    local_8f8 = this_local;
    local_8f0 = value_local.Data;
    local_6c8 = local_908;
    local_6d0 = "true";
    local_908[0] = "true";
    local_3b8 = (char *)strlen("true");
    local_390 = local_8f8;
    local_388 = local_8f0;
    local_3a0 = local_908[0];
    local_3b0 = local_8f8;
    local_3a8 = local_8f0;
    local_3c0 = local_908[0];
    local_360 = local_8f8;
    local_358 = local_8f0;
    local_370 = local_908[0];
    local_380 = local_908[0];
    local_348 = local_908[0];
    local_350 = &local_360;
    bVar3 = false;
    local_398 = local_3b8;
    local_378 = local_3b8;
    local_368 = local_3b8;
    local_340 = local_3b8;
    if (local_8f0 == local_3b8) {
      local_18 = local_8f8;
      local_20 = local_908[0];
      local_28 = local_3b8;
      if (local_3b8 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(local_8f8,local_908[0],(size_t)local_3b8);
      }
      bVar3 = local_c == 0;
    }
    bVar4 = false;
    if (!bVar3) {
      local_918 = this_local;
      local_910 = value_local.Data;
      local_6b8 = local_928;
      local_6c0 = "false";
      local_928[0] = "false";
      local_428 = (char *)strlen("false");
      local_400 = local_918;
      local_3f8 = local_910;
      local_410 = local_928[0];
      local_420 = local_918;
      local_418 = local_910;
      local_430 = local_928[0];
      local_3d0 = local_918;
      local_3c8 = local_910;
      local_3e0 = local_928[0];
      local_3f0 = local_928[0];
      local_330 = local_928[0];
      local_338 = &local_3d0;
      bVar4 = false;
      local_408 = local_428;
      local_3e8 = local_428;
      local_3d8 = local_428;
      local_328 = local_428;
      if (local_910 == local_428) {
        local_38 = local_918;
        local_40 = local_928[0];
        local_48 = local_428;
        if (local_428 == (char *)0x0) {
          local_2c = 0;
        }
        else {
          local_2c = memcmp(local_918,local_928[0],(size_t)local_428);
        }
        bVar4 = local_2c == 0;
      }
      bVar4 = (bool)(bVar4 ^ 1);
    }
    pCVar1 = local_8c8;
    if (bVar4) {
      llvm::operator+(&local_988,"invalid value: \'",(StringRef *)&this_local);
      llvm::Twine::Twine(&local_9a0,"\' for attribute \'");
      llvm::operator+(&local_970,&local_988,&local_9a0);
      llvm::Twine::Twine(&local_9b8,(StringRef *)&value_local.Length);
      llvm::operator+(&local_958,&local_970,&local_9b8);
      llvm::Twine::Twine(&local_9d0,"\'");
      llvm::operator+(&local_940,&local_958,&local_9d0);
      ConfigureContext::error(pCVar1,&local_940);
      name_local.Length._7_1_ = false;
    }
    else {
      local_9e0 = this_local;
      local_9d8 = value_local.Data;
      local_6a8 = local_9f0;
      local_6b0 = "true";
      local_9f0[0] = "true";
      local_738 = (char *)strlen("true");
      local_720 = local_9e0;
      local_718 = local_9d8;
      local_730 = local_9f0[0];
      local_740 = local_9f0[0];
      local_2a0 = local_9f0[0];
      local_2a8 = &local_720;
      local_db9 = false;
      if (local_9d8 == local_738) {
        local_f8 = local_9e0;
        local_100 = local_9f0[0];
        if (local_738 == (char *)0x0) {
          local_ec = 0;
        }
        else {
          local_728 = local_738;
          local_298 = local_738;
          local_108 = local_738;
          local_ec = memcmp(local_9e0,local_9f0[0],(size_t)local_738);
        }
        local_db9 = local_ec == 0;
      }
      this->allowMissingInputs = local_db9;
      name_local.Length._7_1_ = true;
    }
  }
  else {
    local_a00 = (void *)value_local.Length;
    local_698 = local_a10;
    local_6a0 = "allow-modified-outputs";
    local_a10[0] = "allow-modified-outputs";
    local_9f8 = sVar2;
    local_768 = strlen("allow-modified-outputs");
    local_750 = local_a00;
    local_748 = local_9f8;
    local_760 = local_a10[0];
    local_770 = local_a10[0];
    local_288 = local_a10[0];
    local_290 = &local_750;
    bVar3 = false;
    local_758 = local_768;
    local_280 = local_768;
    if (local_9f8 == local_768) {
      local_118 = local_a00;
      local_120 = local_a10[0];
      local_128 = local_768;
      if (local_768 == 0) {
        local_10c = 0;
      }
      else {
        local_10c = memcmp(local_a00,local_a10[0],local_768);
      }
      bVar3 = local_10c == 0;
    }
    if (bVar3) {
      local_a20 = this_local;
      local_a18 = value_local.Data;
      local_688 = local_a30;
      local_690 = "true";
      local_a30[0] = "true";
      local_498 = (char *)strlen("true");
      local_470 = local_a20;
      local_468 = local_a18;
      local_480 = local_a30[0];
      local_490 = local_a20;
      local_488 = local_a18;
      local_4a0 = local_a30[0];
      local_440 = local_a20;
      local_438 = local_a18;
      local_450 = local_a30[0];
      local_460 = local_a30[0];
      local_318 = local_a30[0];
      local_320 = &local_440;
      bVar3 = false;
      local_478 = local_498;
      local_458 = local_498;
      local_448 = local_498;
      local_310 = local_498;
      if (local_a18 == local_498) {
        local_58 = local_a20;
        local_60 = local_a30[0];
        local_68 = local_498;
        if (local_498 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(local_a20,local_a30[0],(size_t)local_498);
        }
        bVar3 = local_4c == 0;
      }
      bVar4 = false;
      if (!bVar3) {
        local_a40 = this_local;
        local_a38 = value_local.Data;
        local_678 = local_a50;
        local_680 = "false";
        local_a50[0] = "false";
        local_508 = (char *)strlen("false");
        local_4e0 = local_a40;
        local_4d8 = local_a38;
        local_4f0 = local_a50[0];
        local_500 = local_a40;
        local_4f8 = local_a38;
        local_510 = local_a50[0];
        local_4b0 = local_a40;
        local_4a8 = local_a38;
        local_4c0 = local_a50[0];
        local_4d0 = local_a50[0];
        local_300 = local_a50[0];
        local_308 = &local_4b0;
        bVar4 = false;
        local_4e8 = local_508;
        local_4c8 = local_508;
        local_4b8 = local_508;
        local_2f8 = local_508;
        if (local_a38 == local_508) {
          local_78 = local_a40;
          local_80 = local_a50[0];
          local_88 = local_508;
          if (local_508 == (char *)0x0) {
            local_6c = 0;
          }
          else {
            local_6c = memcmp(local_a40,local_a50[0],(size_t)local_508);
          }
          bVar4 = local_6c == 0;
        }
        bVar4 = (bool)(bVar4 ^ 1);
      }
      pCVar1 = local_8c8;
      if (bVar4) {
        llvm::operator+(&local_ab0,"invalid value: \'",(StringRef *)&this_local);
        llvm::Twine::Twine(&local_ac8,"\' for attribute \'");
        llvm::operator+(&local_a98,&local_ab0,&local_ac8);
        llvm::Twine::Twine(&local_ae0,(StringRef *)&value_local.Length);
        llvm::operator+(&local_a80,&local_a98,&local_ae0);
        llvm::Twine::Twine(&local_af8,"\'");
        llvm::operator+(&local_a68,&local_a80,&local_af8);
        ConfigureContext::error(pCVar1,&local_a68);
        name_local.Length._7_1_ = false;
      }
      else {
        local_b08 = this_local;
        local_b00 = value_local.Data;
        local_668 = local_b18;
        local_670 = "true";
        local_b18[0] = "true";
        local_798 = (char *)strlen("true");
        local_780 = local_b08;
        local_778 = local_b00;
        local_790 = local_b18[0];
        local_7a0 = local_b18[0];
        local_270 = local_b18[0];
        local_278 = &local_780;
        local_e49 = false;
        if (local_b00 == local_798) {
          local_138 = local_b08;
          local_140 = local_b18[0];
          if (local_798 == (char *)0x0) {
            local_12c = 0;
          }
          else {
            local_788 = local_798;
            local_268 = local_798;
            local_148 = local_798;
            local_12c = memcmp(local_b08,local_b18[0],(size_t)local_798);
          }
          local_e49 = local_12c == 0;
        }
        this->allowModifiedOutputs = local_e49;
        name_local.Length._7_1_ = true;
      }
    }
    else {
      local_b28 = (void *)value_local.Length;
      local_658 = local_b38;
      local_660 = "always-out-of-date";
      local_b38[0] = "always-out-of-date";
      local_b20 = sVar2;
      local_7c8 = strlen("always-out-of-date");
      local_7b0 = local_b28;
      local_7a8 = local_b20;
      local_7c0 = local_b38[0];
      local_7d0 = local_b38[0];
      local_258 = local_b38[0];
      local_260 = &local_7b0;
      bVar3 = false;
      local_7b8 = local_7c8;
      local_250 = local_7c8;
      if (local_b20 == local_7c8) {
        local_158 = local_b28;
        local_160 = local_b38[0];
        local_168 = local_7c8;
        if (local_7c8 == 0) {
          local_14c = 0;
        }
        else {
          local_14c = memcmp(local_b28,local_b38[0],local_7c8);
        }
        bVar3 = local_14c == 0;
      }
      if (bVar3) {
        local_b48 = this_local;
        local_b40 = value_local.Data;
        local_648 = local_b58;
        local_650 = "true";
        local_b58[0] = "true";
        local_578 = (char *)strlen("true");
        local_550 = local_b48;
        local_548 = local_b40;
        local_560 = local_b58[0];
        local_570 = local_b48;
        local_568 = local_b40;
        local_580 = local_b58[0];
        local_520 = local_b48;
        local_518 = local_b40;
        local_530 = local_b58[0];
        local_540 = local_b58[0];
        local_2e8 = local_b58[0];
        local_2f0 = &local_520;
        bVar3 = false;
        local_558 = local_578;
        local_538 = local_578;
        local_528 = local_578;
        local_2e0 = local_578;
        if (local_b40 == local_578) {
          local_98 = local_b48;
          local_a0 = local_b58[0];
          local_a8 = local_578;
          if (local_578 == (char *)0x0) {
            local_8c = 0;
          }
          else {
            local_8c = memcmp(local_b48,local_b58[0],(size_t)local_578);
          }
          bVar3 = local_8c == 0;
        }
        bVar4 = false;
        if (!bVar3) {
          local_b68 = this_local;
          local_b60 = value_local.Data;
          local_638 = local_b78;
          local_640 = "false";
          local_b78[0] = "false";
          local_5e8 = (char *)strlen("false");
          local_5c0 = local_b68;
          local_5b8 = local_b60;
          local_5d0 = local_b78[0];
          local_5e0 = local_b68;
          local_5d8 = local_b60;
          local_5f0 = local_b78[0];
          local_590 = local_b68;
          local_588 = local_b60;
          local_5a0 = local_b78[0];
          local_5b0 = local_b78[0];
          local_2d0 = local_b78[0];
          local_2d8 = &local_590;
          bVar4 = false;
          local_5c8 = local_5e8;
          local_5a8 = local_5e8;
          local_598 = local_5e8;
          local_2c8 = local_5e8;
          if (local_b60 == local_5e8) {
            local_b8 = local_b68;
            local_c0 = local_b78[0];
            local_c8 = local_5e8;
            if (local_5e8 == (char *)0x0) {
              local_ac = 0;
            }
            else {
              local_ac = memcmp(local_b68,local_b78[0],(size_t)local_5e8);
            }
            bVar4 = local_ac == 0;
          }
          bVar4 = (bool)(bVar4 ^ 1);
        }
        pCVar1 = local_8c8;
        if (bVar4) {
          llvm::operator+(&local_bd8,"invalid value: \'",(StringRef *)&this_local);
          llvm::Twine::Twine(&local_bf0,"\' for attribute \'");
          llvm::operator+(&local_bc0,&local_bd8,&local_bf0);
          llvm::Twine::Twine(&local_c08,(StringRef *)&value_local.Length);
          llvm::operator+(&local_ba8,&local_bc0,&local_c08);
          llvm::Twine::Twine(&local_c20,"\'");
          llvm::operator+(&local_b90,&local_ba8,&local_c20);
          ConfigureContext::error(pCVar1,&local_b90);
          name_local.Length._7_1_ = false;
        }
        else {
          local_c30 = this_local;
          local_c28 = value_local.Data;
          local_628 = local_c40;
          local_630 = "true";
          local_c40[0] = "true";
          local_7f8 = (char *)strlen("true");
          local_7e0 = local_c30;
          local_7d8 = local_c28;
          local_7f0 = local_c40[0];
          local_800 = local_c40[0];
          local_240 = local_c40[0];
          local_248 = &local_7e0;
          local_ed9 = false;
          if (local_c28 == local_7f8) {
            local_178 = local_c30;
            local_180 = local_c40[0];
            if (local_7f8 == (char *)0x0) {
              local_16c = 0;
            }
            else {
              local_7e8 = local_7f8;
              local_238 = local_7f8;
              local_188 = local_7f8;
              local_16c = memcmp(local_c30,local_c40[0],(size_t)local_7f8);
            }
            local_ed9 = local_16c == 0;
          }
          this->alwaysOutOfDate = local_ed9;
          name_local.Length._7_1_ = true;
        }
      }
      else {
        local_c50 = (void *)value_local.Length;
        local_618 = local_c60;
        local_620 = "repair-via-ownership-analysis";
        local_c60[0] = "repair-via-ownership-analysis";
        local_c48 = sVar2;
        local_828 = strlen("repair-via-ownership-analysis");
        local_810 = local_c50;
        local_808 = local_c48;
        local_820 = local_c60[0];
        local_830 = local_c60[0];
        local_228 = local_c60[0];
        local_230 = &local_810;
        bVar3 = false;
        local_818 = local_828;
        local_220 = local_828;
        if (local_c48 == local_828) {
          local_198 = local_c50;
          local_1a0 = local_c60[0];
          local_1a8 = local_828;
          if (local_828 == 0) {
            local_18c = 0;
          }
          else {
            local_18c = memcmp(local_c50,local_c60[0],local_828);
          }
          bVar3 = local_18c == 0;
        }
        pCVar1 = local_8c8;
        if (bVar3) {
          local_c70 = this_local;
          local_c68 = value_local.Data;
          local_608 = local_c80;
          local_610 = "true";
          local_c80[0] = "true";
          local_858 = (char *)strlen("true");
          local_840 = local_c70;
          local_838 = local_c68;
          local_850 = local_c80[0];
          local_860 = local_c80[0];
          local_210 = local_c80[0];
          local_218 = &local_840;
          bVar3 = false;
          local_848 = local_858;
          local_208 = local_858;
          if (local_c68 == local_858) {
            local_1b8 = local_c70;
            local_1c0 = local_c80[0];
            local_1c8 = local_858;
            if (local_858 == (char *)0x0) {
              local_1ac = 0;
            }
            else {
              local_1ac = memcmp(local_c70,local_c80[0],(size_t)local_858);
            }
            bVar3 = local_1ac == 0;
          }
          if (bVar3) {
            (this->super_Command).repairViaOwnershipAnalysis = true;
            name_local.Length._7_1_ = true;
          }
          else {
            local_c90 = this_local;
            local_c88 = value_local.Data;
            local_5f8 = local_ca0;
            local_600 = "false";
            local_ca0[0] = "false";
            local_1f0 = (char *)strlen("false");
            local_870 = local_c90;
            local_868 = local_c88;
            local_1f8 = local_ca0[0];
            local_200 = &local_870;
            bVar3 = false;
            if (local_c88 == local_1f0) {
              local_1d8 = local_c90;
              local_1e0 = local_ca0[0];
              local_1e8 = local_1f0;
              if (local_1f0 == (char *)0x0) {
                local_1cc = 0;
              }
              else {
                local_1cc = memcmp(local_c90,local_ca0[0],(size_t)local_1f0);
              }
              bVar3 = local_1cc == 0;
            }
            pCVar1 = local_8c8;
            if (bVar3) {
              (this->super_Command).repairViaOwnershipAnalysis = false;
              name_local.Length._7_1_ = true;
            }
            else {
              llvm::operator+(&local_cd0,"invalid value for attribute: \'",
                              (StringRef *)&value_local.Length);
              llvm::Twine::Twine(&local_ce8,"\'");
              llvm::operator+(&local_cb8,&local_cd0,&local_ce8);
              ConfigureContext::error(pCVar1,&local_cb8);
              name_local.Length._7_1_ = false;
            }
          }
        }
        else {
          llvm::operator+(&local_d18,"unexpected attribute: \'",(StringRef *)&value_local.Length);
          llvm::Twine::Twine(&local_d30,"\'");
          llvm::operator+(&local_d00,&local_d18,&local_d30);
          ConfigureContext::error(pCVar1,&local_d00);
          name_local.Length._7_1_ = false;
        }
      }
    }
  }
  return name_local.Length._7_1_;
}

Assistant:

bool ExternalCommand::
configureAttribute(const ConfigureContext& ctx, StringRef name,
                   StringRef value) {
  if (name == "allow-missing-inputs") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    allowMissingInputs = value == "true";
    return true;
  } else if (name == "allow-modified-outputs") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    allowModifiedOutputs = value == "true";
    return true;
  } else if (name == "always-out-of-date") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    alwaysOutOfDate = value == "true";
    return true;
    
  } else if (name == "repair-via-ownership-analysis") {
    if (value == "true") {
      repairViaOwnershipAnalysis = true;
      return true;
    } else if (value == "false") {
      repairViaOwnershipAnalysis = false;
      return true;
    } else {
      ctx.error("invalid value for attribute: '" + name + "'");
      return false;
    }
  } else {
    ctx.error("unexpected attribute: '" + name + "'");
    return false;
  }
}